

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O0

void statemachine_set_transition_error_message(statemachine_ctx *ctx)

{
  char local_1a [8];
  char encoded_char [10];
  statemachine_ctx *ctx_local;
  
  encoded_char._2_8_ = ctx;
  statemachine_encode_char(ctx->current_char,local_1a,10);
  if (*(long *)(*(long *)(encoded_char._2_8_ + 8) + 0x10) == 0) {
    snprintf((char *)(encoded_char._2_8_ + 300),0x50,"Unexpected character \'%s\'",local_1a);
  }
  else {
    snprintf((char *)(encoded_char._2_8_ + 300),0x50,"Unexpected character \'%s\' in state \'%s\'",
             local_1a,*(undefined8 *)
                       (*(long *)(*(long *)(encoded_char._2_8_ + 8) + 0x10) +
                       (long)*(int *)encoded_char._2_8_ * 8));
  }
  return;
}

Assistant:

static void statemachine_set_transition_error_message(statemachine_ctx *ctx)
{
  char encoded_char[10];
  statemachine_encode_char(ctx->current_char, encoded_char,
                           sizeof(encoded_char));

  if (ctx->definition->state_names) {
    snprintf(ctx->error_msg, STATEMACHINE_MAX_STR_ERROR,
             "Unexpected character '%s' in state '%s'",
             encoded_char,
             ctx->definition->state_names[ctx->current_state]);
  } else {
    snprintf(ctx->error_msg, STATEMACHINE_MAX_STR_ERROR,
             "Unexpected character '%s'", encoded_char);
  }

}